

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::sremovevertex(tetgenmesh *this,point delpt,face *parentsh,face *parentseg,int lawson)

{
  shellface *pppdVar1;
  uint *puVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  shellface ppdVar7;
  shellface ppdVar8;
  undefined8 *puVar9;
  memorypool *pmVar10;
  point pd;
  long *plVar11;
  char **ppcVar12;
  shellface *pppdVar13;
  long lVar14;
  char *pcVar15;
  long lVar16;
  arraypool *paVar17;
  char *pcVar18;
  uint uVar19;
  ulong uVar20;
  shellface *pppdVar21;
  shellface ppdVar22;
  ulong uVar23;
  long lVar24;
  int *piVar25;
  ulong uVar26;
  ulong *puVar27;
  undefined8 *puVar28;
  uint uVar29;
  double dVar30;
  face abseg;
  face local_d8;
  long local_c8;
  char *local_c0;
  face *local_b8;
  shellface local_b0;
  shellface local_a8;
  shellface local_a0;
  shellface local_98;
  int local_8c;
  face local_88;
  ulong local_78;
  uint local_70;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 *local_48;
  face local_40;
  
  lVar14 = 0;
  do {
    *(undefined8 *)((long)&local_88.sh + lVar14) = 0;
    *(undefined4 *)((long)&local_88.shver + lVar14) = 0;
    lVar14 = lVar14 + 0x10;
  } while (lVar14 != 0x40);
  if (parentseg == (face *)0x0) {
    if (2 < this->b->verbose) {
      printf("      Remove vertex %d from surface.\n",
             (ulong)*(uint *)((long)delpt + (long)this->pointmarkindex * 4));
    }
    parentsh->shver = snextpivot[parentsh->shver];
    paVar17 = this->cavesegshlist;
    pcVar15 = arraypool::getblock(paVar17,(int)paVar17->objects);
    lVar14 = (long)paVar17->objectbytes * ((long)paVar17->objectsperblock - 1U & paVar17->objects);
    paVar17->objects = paVar17->objects + 1;
    *(shellface **)(pcVar15 + lVar14) = parentsh->sh;
    *(int *)(pcVar15 + lVar14 + 8) = parentsh->shver;
  }
  else {
    local_40.sh = (shellface *)0x0;
    local_40.shver = 0;
    local_d8.sh = (shellface *)0x0;
    local_d8.shver = 0;
    local_48 = (undefined8 *)
               ((ulong)parentseg->sh[snextpivot[snextpivot[parentseg->shver]] >> 1] &
               0xfffffffffffffff8);
    ppdVar22 = (shellface)local_48[sorgpivot[0]];
    ppdVar7 = parentseg->sh[sdestpivot[parentseg->shver]];
    local_b8 = parentseg;
    if (2 < this->b->verbose) {
      lVar14 = (long)this->pointmarkindex;
      printf("      Remove vertex %d from segment [%d, %d].\n",
             (ulong)*(uint *)((long)delpt + lVar14 * 4),
             (ulong)*(uint *)((long)ppdVar22 + lVar14 * 4),
             (ulong)*(uint *)((long)ppdVar7 + lVar14 * 4));
    }
    makeshellface(this,this->subsegs,&local_40);
    pppdVar13 = local_40.sh;
    local_8c = local_40.shver;
    uVar26 = (ulong)local_40.shver;
    local_40.sh[sorgpivot[uVar26]] = ppdVar22;
    local_40.sh[sdestpivot[uVar26]] = ppdVar7;
    local_40.sh[sapexpivot[uVar26]] = (shellface)0x0;
    pppdVar21 = local_b8->sh;
    *(undefined4 *)((long)local_40.sh + (long)this->shmarkindex * 4) =
         *(undefined4 *)((long)pppdVar21 + (long)this->shmarkindex * 4);
    if (this->checkconstraints != 0) {
      local_40.sh[this->areaboundindex] = pppdVar21[this->areaboundindex];
    }
    if (this->useinsertradius != 0) {
      *(undefined4 *)((long)local_40.sh + (long)this->shmarkindex * 4 + 8) =
           *(undefined4 *)((long)pppdVar21 + (long)this->shmarkindex * 4 + 8);
    }
    uVar20 = (ulong)snextpivot[0];
    iVar4 = snextpivot[uVar20];
    lVar14 = (long)(iVar4 >> 1);
    uVar23 = local_48[lVar14] & 0xfffffffffffffff8;
    if (uVar23 != 0) {
      iVar5 = snextpivot[snextpivot[uVar26]];
      *(ulong *)(uVar23 + (long)(snextpivot[0] >> 1) * 8) = (long)iVar5 | (ulong)local_40.sh;
      local_40.sh[iVar5 >> 1] = (shellface)(uVar23 | uVar20);
    }
    iVar5 = local_b8->shver;
    uVar20 = (ulong)local_b8->sh[snextpivot[iVar5] >> 1] & 0xfffffffffffffff8;
    if (uVar20 != 0) {
      iVar6 = snextpivot[uVar26];
      *(ulong *)(uVar20 + lVar14 * 8) = (long)iVar6 | (ulong)local_40.sh;
      local_40.sh[iVar6 >> 1] = (shellface)((long)iVar4 | uVar20);
    }
    local_b0 = (shellface)(uVar26 | (ulong)local_40.sh);
    iVar4 = this->point2simindex;
    ppdVar22[(long)iVar4 + 2] = (double *)local_b0;
    ppdVar7[(long)iVar4 + 2] = (double *)local_b0;
    ppdVar8 = local_b8->sh[iVar5 >> 1];
    uVar29 = (uint)ppdVar8 & 7;
    parentsh->shver = uVar29;
    pppdVar21 = (shellface *)((ulong)ppdVar8 & 0xfffffffffffffff8);
    parentsh->sh = pppdVar21;
    local_a8 = ppdVar22;
    local_98 = ppdVar7;
    if (pppdVar21 != (shellface *)0x0) {
      do {
        paVar17 = this->caveshlist;
        pcVar15 = arraypool::getblock(paVar17,(int)paVar17->objects);
        lVar14 = (long)paVar17->objectbytes *
                 ((long)paVar17->objectsperblock - 1U & paVar17->objects);
        paVar17->objects = paVar17->objects + 1;
        *(shellface **)(pcVar15 + lVar14) = pppdVar21;
        *(uint *)(pcVar15 + lVar14 + 8) = uVar29;
        pppdVar1 = pppdVar21 + (uVar29 >> 1);
        pppdVar21 = (shellface *)((ulong)*pppdVar1 & 0xfffffffffffffff8);
        if (pppdVar21 == (shellface *)0x0) break;
        uVar29 = (uint)*pppdVar1 & 7;
      } while (parentsh->sh != pppdVar21);
    }
    paVar17 = this->caveshlist;
    if (0 < paVar17->objects) {
      pcVar15 = (char *)0x0;
      do {
        lVar14 = (long)paVar17->objectbytes *
                 (long)(int)(paVar17->objectsperblockmark & (uint)pcVar15);
        puVar9 = *(undefined8 **)
                  (paVar17->toparray[(uint)pcVar15 >> ((byte)paVar17->log2objectsperblock & 0x1f)] +
                  lVar14);
        uVar29 = *(uint *)(paVar17->toparray
                           [(uint)pcVar15 >> ((byte)paVar17->log2objectsperblock & 0x1f)] +
                          lVar14 + 8);
        uVar20 = (ulong)(int)((point)puVar9[sorgpivot[(int)uVar29]] != delpt ^ uVar29);
        iVar4 = snextpivot[snextpivot[uVar20]];
        puVar27 = puVar9 + (iVar4 >> 1);
        uVar26 = puVar27[6];
        puVar28 = puVar9;
        while (uVar26 < 8) {
          uVar19 = (uint)*puVar27 & 7;
          puVar28 = (undefined8 *)(*puVar27 & 0xfffffffffffffff8);
          iVar4 = snextpivot[snextpivot[(point)puVar28[sorgpivot[uVar19]] != delpt ^ uVar19]];
          puVar27 = puVar28 + (iVar4 >> 1);
          uVar26 = puVar27[6];
        }
        local_c0 = pcVar15;
        if (puVar28 == puVar9) {
          uVar29 = (uint)puVar28[snextpivot[snextpivot[iVar4]] >> 1];
          local_d8.shver = uVar29 & 7;
          local_d8.sh = (shellface *)
                        (puVar28[snextpivot[snextpivot[iVar4]] >> 1] & 0xfffffffffffffff8);
          local_d8.shver =
               (uint)(local_d8.sh[sorgpivot[(uint)local_d8.shver]] != local_a8) ^ local_d8.shver;
          uVar26 = (ulong)(uVar29 & 6);
          *(undefined8 *)((long)local_d8.sh + uVar26 * 4) = 0;
          *(shellface *)((long)local_d8.sh + uVar26 * 4 + 0x30) = local_b0;
          *pppdVar13 = (shellface)((ulong)(uint)local_d8.shver + (long)local_d8.sh);
          pmVar10 = this->subfaces;
          puVar28[3] = 0;
          *puVar28 = pmVar10->deaditemstack;
          pmVar10->deaditemstack = puVar28;
          pmVar10->items = pmVar10->items + -1;
        }
        else {
          local_c8 = (long)((int)uVar29 >> 1);
          puVar9[local_c8 + 6] = 0;
          puVar27[6] = 0;
          local_a0 = (shellface)(long)iVar4;
          makeshellface(this,this->subfaces,&local_d8);
          uVar26 = (ulong)local_d8.shver;
          local_d8.sh[sorgpivot[uVar26]] = local_a8;
          local_d8.sh[sdestpivot[uVar26]] = local_98;
          local_d8.sh[sapexpivot[uVar26]] = (shellface)delpt;
          *(undefined4 *)((long)local_d8.sh + (long)this->shmarkindex * 4) =
               *(undefined4 *)((long)puVar9 + (long)this->shmarkindex * 4);
          local_d8.sh[(long)(local_d8.shver >> 1) + 6] = local_b0;
          *pppdVar13 = (shellface)(uVar26 | (ulong)local_d8.sh);
          iVar4 = snextpivot[uVar26];
          local_d8.sh[iVar4 >> 1] = (shellface)(uVar20 | (ulong)puVar9);
          puVar9[local_c8] = (long)iVar4 | (ulong)local_d8.sh;
          iVar4 = snextpivot[iVar4];
          local_d8.sh[iVar4 >> 1] = (shellface)((ulong)local_a0 | (ulong)puVar28);
          *puVar27 = (long)iVar4 | (ulong)local_d8.sh;
          puVar2 = (uint *)((long)local_d8.sh + (long)this->shmarkindex * 4 + 4);
          *puVar2 = *puVar2 | 2;
        }
        paVar17 = this->cavesegshlist;
        pcVar15 = arraypool::getblock(paVar17,(int)paVar17->objects);
        lVar14 = (long)paVar17->objectbytes *
                 ((long)paVar17->objectsperblock - 1U & paVar17->objects);
        paVar17->objects = paVar17->objects + 1;
        *(shellface **)(pcVar15 + lVar14) = local_d8.sh;
        *(int *)(pcVar15 + lVar14 + 8) = local_d8.shver;
        pcVar15 = local_c0 + 1;
        paVar17 = this->caveshlist;
      } while ((long)pcVar15 < paVar17->objects);
    }
    paVar17->objects = 0;
    if (1 < this->cavesegshlist->objects) {
      paVar17 = this->cavesegshlist;
      lVar14 = paVar17->objects;
      if (0 < lVar14) {
        lVar24 = 0;
        do {
          bVar3 = (byte)paVar17->log2objectsperblock;
          pcVar15 = paVar17->toparray[(uint)lVar24 >> (bVar3 & 0x1f)];
          lVar16 = (long)(int)((paVar17->objectsperblockmark & (uint)lVar24) * paVar17->objectbytes)
          ;
          local_d8.sh = *(shellface **)(pcVar15 + lVar16);
          local_d8.shver = *(int *)(pcVar15 + lVar16 + 8);
          lVar24 = lVar24 + 1;
          uVar29 = (uint)(lVar24 % lVar14);
          pcVar15 = paVar17->toparray[uVar29 >> (bVar3 & 0x1f)];
          lVar14 = (long)(int)((paVar17->objectsperblockmark & uVar29) * paVar17->objectbytes);
          local_d8.sh[local_d8.shver >> 1] =
               (shellface)((long)*(int *)(pcVar15 + lVar14 + 8) | *(ulong *)(pcVar15 + lVar14));
          paVar17 = this->cavesegshlist;
          lVar14 = paVar17->objects;
        } while (lVar24 < lVar14);
      }
    }
    pmVar10 = this->subsegs;
    pppdVar21 = local_b8->sh;
    pppdVar21[3] = (shellface)0x0;
    *pppdVar21 = (shellface)pmVar10->deaditemstack;
    pmVar10->deaditemstack = pppdVar21;
    pmVar10->items = pmVar10->items + -1;
    pmVar10 = this->subsegs;
    local_48[3] = 0;
    *local_48 = pmVar10->deaditemstack;
    pmVar10->deaditemstack = local_48;
    pmVar10->items = pmVar10->items + -1;
    local_b8->sh = pppdVar13;
    local_b8->shver = local_8c;
  }
  paVar17 = this->cavesegshlist;
  if (0 < paVar17->objects) {
    ppdVar22 = (shellface)0x0;
    do {
      pcVar15 = paVar17->toparray[(uint)ppdVar22 >> ((byte)paVar17->log2objectsperblock & 0x1f)];
      lVar14 = (long)paVar17->objectbytes *
               (long)(int)(paVar17->objectsperblockmark & (uint)ppdVar22);
      iVar4 = snextpivot[*(int *)(pcVar15 + lVar14 + 8)];
      *(int *)(pcVar15 + lVar14 + 8) = iVar4;
      uVar26 = *(ulong *)(*(long *)(pcVar15 + lVar14) + (long)(iVar4 >> 1) * 8);
      uVar29 = (uint)uVar26 & 7;
      *(uint *)(pcVar15 + lVar14 + 8) = uVar29;
      uVar26 = uVar26 & 0xfffffffffffffff8;
      *(ulong *)(pcVar15 + lVar14) = uVar26;
      if (*(point *)(uVar26 + (long)sorgpivot[uVar29] * 8) != delpt) {
        *(uint *)(pcVar15 + lVar14 + 8) = uVar29 ^ 1;
      }
      lVar24 = lVar14;
      pcVar18 = pcVar15;
      if (*(point *)(uVar26 + (long)sorgpivot[*(int *)(pcVar15 + lVar14 + 8)] * 8) == delpt) {
        while( true ) {
          local_98 = ppdVar22;
          local_c0 = pcVar18;
          local_c8 = lVar24;
          uVar26 = *(ulong *)(pcVar15 + lVar14);
          uVar29 = *(uint *)(pcVar15 + lVar14 + 8);
          while( true ) {
            paVar17 = this->caveshlist;
            pcVar15 = arraypool::getblock(paVar17,(int)paVar17->objects);
            ppdVar22 = local_98;
            lVar14 = (long)paVar17->objectbytes *
                     ((long)paVar17->objectsperblock - 1U & paVar17->objects);
            paVar17->objects = paVar17->objects + 1;
            *(ulong *)(pcVar15 + lVar14) = uVar26;
            *(uint *)(pcVar15 + lVar14 + 8) = uVar29;
            uVar20 = *(ulong *)(uVar26 + (long)(snextpivot[snextpivot[(int)uVar29]] >> 1) * 8);
            uVar26 = uVar20 & 0xfffffffffffffff8;
            if (*(ulong *)(local_c0 + local_c8) == uVar26) break;
            uVar29 = (uint)uVar20 & 7;
            uVar29 = *(point *)(uVar26 + (long)sorgpivot[uVar29] * 8) != delpt ^ uVar29;
          }
          paVar17 = this->caveshlist;
          if (paVar17->objects == 3) break;
          paVar17 = this->caveshlist;
          if (paVar17->objects < 1) {
            lVar24 = 0;
            lVar14 = local_c8;
            pcVar15 = local_c0;
            pppdVar21 = local_88.sh;
            iVar4 = local_88.shver;
            uVar26 = local_78;
            uVar29 = local_70;
          }
          else {
            lVar24 = 0;
            do {
              lVar14 = (long)paVar17->objectbytes *
                       (long)(int)(paVar17->objectsperblockmark & (uint)lVar24);
              pppdVar21 = *(shellface **)
                           (paVar17->toparray
                            [(uint)lVar24 >> ((byte)paVar17->log2objectsperblock & 0x1f)] + lVar14);
              iVar4 = *(int *)(paVar17->toparray
                               [(uint)lVar24 >> ((byte)paVar17->log2objectsperblock & 0x1f)] +
                              lVar14 + 8);
              uVar29 = (uint)pppdVar21[iVar4 >> 1] & 7;
              uVar26 = (ulong)pppdVar21[iVar4 >> 1] & 0xfffffffffffffff8;
              ppdVar22 = pppdVar21[sorgpivot[iVar4]];
              uVar29 = ppdVar22 != *(shellface *)(uVar26 + (long)sdestpivot[uVar29] * 8) ^ uVar29;
              if (((*(byte *)((long)pppdVar21 + (long)this->shmarkindex * 4 + 4) & 2) == 0) &&
                 ((*(byte *)(uVar26 + 4 + (long)this->shmarkindex * 4) & 2) == 0)) {
                local_a8 = pppdVar21[sdestpivot[iVar4]];
                local_a0 = pppdVar21[sapexpivot[iVar4]];
                pd = *(point *)(uVar26 + (long)sapexpivot[uVar29] * 8);
                calculateabovepoint4(this,(point)ppdVar22,(point)local_a8,(point)local_a0,pd);
                local_b0 = (shellface)
                           orient3d((double *)local_a0,pd,this->dummypoint,(double *)ppdVar22);
                dVar30 = orient3d((double *)local_a0,pd,this->dummypoint,(double *)local_a8);
                if (dVar30 * (double)local_b0 < 0.0) {
                  local_88.sh = pppdVar21;
                  local_88.shver = iVar4;
                  local_78 = uVar26;
                  local_70 = uVar29;
                  flip22(this,&local_88,lawson,0);
                  pcVar15 = local_c0;
                  lVar14 = local_c8;
                  *(ulong *)(local_c0 + local_c8) = local_78;
                  *(int *)(local_c0 + local_c8 + 8) = snextpivot[snextpivot[(int)local_70]];
                  paVar17 = this->caveshbdlist;
                  pcVar18 = arraypool::getblock(paVar17,(int)paVar17->objects);
                  lVar16 = (long)paVar17->objectbytes *
                           ((long)paVar17->objectsperblock - 1U & paVar17->objects);
                  paVar17->objects = paVar17->objects + 1;
                  *(shellface **)(pcVar18 + lVar16) = local_88.sh;
                  *(int *)(pcVar18 + lVar16 + 8) = local_88.shver;
                  pppdVar21 = local_88.sh;
                  iVar4 = local_88.shver;
                  uVar26 = local_78;
                  uVar29 = local_70;
                  break;
                }
              }
              lVar24 = lVar24 + 1;
              paVar17 = this->caveshlist;
              lVar14 = local_c8;
              pcVar15 = local_c0;
            } while (lVar24 < paVar17->objects);
          }
          local_70 = uVar29;
          local_78 = uVar26;
          local_88.shver = iVar4;
          local_88.sh = pppdVar21;
          if (this->caveshlist->objects == lVar24) {
            plVar11 = (long *)*this->caveshlist->toparray;
            local_88.sh = (shellface *)*plVar11;
            local_88.shver = (int)plVar11[1];
            local_70 = (uint)local_88.sh[local_88.shver >> 1] & 7;
            local_78 = (ulong)local_88.sh[local_88.shver >> 1] & 0xfffffffffffffff8;
            if (local_88.sh[sorgpivot[local_88.shver]] !=
                *(shellface *)(local_78 + (long)sdestpivot[local_70] * 8)) {
              local_70 = local_70 ^ 1;
            }
            flip22(this,&local_88,lawson,0);
            *(ulong *)(pcVar15 + lVar14) = local_78;
            *(int *)(pcVar15 + lVar14 + 8) = snextpivot[snextpivot[(int)local_70]];
            paVar17 = this->caveshbdlist;
            pcVar18 = arraypool::getblock(paVar17,(int)paVar17->objects);
            lVar24 = (long)paVar17->objectbytes *
                     ((long)paVar17->objectsperblock - 1U & paVar17->objects);
            paVar17->objects = paVar17->objects + 1;
            *(shellface **)(pcVar18 + lVar24) = local_88.sh;
            *(int *)(pcVar18 + lVar24 + 8) = local_88.shver;
          }
          this->caveshlist->objects = 0;
          lVar24 = local_c8;
          pcVar18 = local_c0;
          ppdVar22 = local_98;
        }
        ppcVar12 = paVar17->toparray;
        iVar4 = paVar17->log2objectsperblock;
        uVar29 = paVar17->objectsperblockmark;
        iVar5 = paVar17->objectbytes;
        piVar25 = &local_88.shver;
        lVar14 = 0;
        do {
          pcVar15 = ppcVar12[(uint)lVar14 >> ((byte)iVar4 & 0x1f)];
          lVar24 = (long)(int)((uint)lVar14 & uVar29) * (long)iVar5;
          ((face *)(piVar25 + -2))->sh = *(shellface **)(pcVar15 + lVar24);
          *piVar25 = *(int *)(pcVar15 + lVar24 + 8);
          lVar14 = lVar14 + 1;
          piVar25 = piVar25 + 4;
        } while (lVar14 != 3);
        flip31(this,&local_88,lawson);
        lVar14 = 0;
        do {
          pmVar10 = this->subfaces;
          puVar9 = *(undefined8 **)((long)&local_88.sh + lVar14);
          puVar9[3] = 0;
          *puVar9 = pmVar10->deaditemstack;
          pmVar10->deaditemstack = puVar9;
          pmVar10->items = pmVar10->items + -1;
          lVar14 = lVar14 + 0x10;
        } while (lVar14 != 0x30);
        this->caveshlist->objects = 0;
        paVar17 = this->caveshbdlist;
        pcVar15 = arraypool::getblock(paVar17,(int)paVar17->objects);
        lVar14 = (long)paVar17->objectbytes *
                 ((long)paVar17->objectsperblock - 1U & paVar17->objects);
        paVar17->objects = paVar17->objects + 1;
        *(undefined8 *)(pcVar15 + lVar14) = local_58;
        *(undefined4 *)(pcVar15 + lVar14 + 8) = local_50;
      }
      ppdVar22 = (shellface)((long)ppdVar22 + 1);
      paVar17 = this->cavesegshlist;
    } while ((long)ppdVar22 < paVar17->objects);
  }
  paVar17->objects = 0;
  if (2 < this->b->verbose) {
    printf("      Created %ld new subfaces.\n",this->caveshbdlist->objects);
  }
  if (lawson != 0) {
    lawsonflip(this);
  }
  return 0;
}

Assistant:

int tetgenmesh::sremovevertex(point delpt, face* parentsh, face* parentseg,
                              int lawson)
{
  face flipfaces[4], spinsh, *parysh;
  point pa, pb, pc, pd;
  REAL ori1, ori2;
  int it, i, j;

  if (parentseg != NULL) {
    // 'delpt' (p) should be a Steiner point inserted in a segment [a,b],
    //   where 'parentseg' should be [p,b]. Find the segment [a,p].
    face startsh, neighsh, nextsh;
    face abseg, prevseg, checkseg;
    face adjseg1, adjseg2;
    face fakesh;
    senext2(*parentseg, prevseg);
    spivotself(prevseg);
    prevseg.shver = 0;
    // Restore the original segment [a,b].
    pa = sorg(prevseg);
    pb = sdest(*parentseg);
    if (b->verbose > 2) {
      printf("      Remove vertex %d from segment [%d, %d].\n", 
             pointmark(delpt), pointmark(pa), pointmark(pb));
    }
    makeshellface(subsegs, &abseg);
    setshvertices(abseg, pa, pb, NULL);
    setshellmark(abseg, shellmark(*parentseg));
    if (checkconstraints) {
      setareabound(abseg, areabound(*parentseg));
    }
    if (useinsertradius) {
      setfacetindex(abseg, getfacetindex(*parentseg));
    }
    // Connect [#, a]<->[a, b].
    senext2(prevseg, adjseg1);
    spivotself(adjseg1);
    if (adjseg1.sh != NULL) {
      adjseg1.shver = 0;
      senextself(adjseg1);
      senext2(abseg, adjseg2);
      sbond(adjseg1, adjseg2);
    }
    // Connect [a, b]<->[b, #].
    senext(*parentseg, adjseg1);
    spivotself(adjseg1);
    if (adjseg1.sh != NULL) {
      adjseg1.shver = 0;
      senext2self(adjseg1);
      senext(abseg, adjseg2);
      sbond(adjseg1, adjseg2);
    }
    // Update the point-to-segment map.
    setpoint2sh(pa, sencode(abseg));
    setpoint2sh(pb, sencode(abseg));

    // Get the faces in face ring at segment [p, b].
    //   Re-use array 'caveshlist'.
    spivot(*parentseg, *parentsh);
    if (parentsh->sh != NULL) {
      spinsh = *parentsh;
      while (1) {
        // Save this face in list.
        caveshlist->newindex((void **) &parysh);
        *parysh = spinsh;
        // Go to the next face in the ring.
        spivotself(spinsh);
        if (spinsh.sh == NULL) {
          break; // It is possible there is only one facet.
        }
        if (spinsh.sh == parentsh->sh) break;
      }
    }

    // Create the face ring of the new segment [a,b]. Each face in the ring
    //   is [a,b,p] (degenerated!). It will be removed (automatically).
    for (i = 0; i < caveshlist->objects; i++) {
      parysh = (face *) fastlookup(caveshlist, i);
      startsh = *parysh;
      if (sorg(startsh) != delpt) {
        sesymself(startsh);
      }      
      // startsh is [p, b, #1], find the subface [a, p, #2].
      neighsh = startsh;
      while (1) {
        senext2self(neighsh);
        sspivot(neighsh, checkseg);
        if (checkseg.sh != NULL) {
          // It must be the segment [a, p].
          break;
        }
        spivotself(neighsh);
        if (sorg(neighsh) != delpt) sesymself(neighsh);
      }
      // Now neighsh is [a, p, #2].
      if (neighsh.sh != startsh.sh) {
        // Detach the two subsegments [a,p] and [p,b] from subfaces.
        ssdissolve(startsh);
        ssdissolve(neighsh);
        // Create a degenerated subface [a,b,p]. It is used to: (1) hold the
        //   new segment [a,b]; (2) connect to the two adjacent subfaces
        //   [p,b,#] and [a,p,#].
        makeshellface(subfaces, &fakesh);
        setshvertices(fakesh, pa, pb, delpt);
        setshellmark(fakesh, shellmark(startsh));
        // Connect fakesh to the segment [a,b].
        ssbond(fakesh, abseg);
        // Connect fakesh to adjacent subfaces: [p,b,#1] and [a,p,#2].
        senext(fakesh, nextsh);
        sbond(nextsh, startsh);
        senext2(fakesh, nextsh);
        sbond(nextsh, neighsh);
        smarktest(fakesh); // Mark it as faked.
      } else {
        // Special case. There exists already a degenerated face [a,b,p]!
        //   There is no need to create a faked subface here.
        senext2self(neighsh); // [a,b,p]
        // Since we will re-connect the face ring using the faked subfaces.
        //   We put the adjacent face of [a,b,p] to the list.
        spivot(neighsh, startsh); // The original adjacent subface.
        if (sorg(startsh) != pa) sesymself(startsh);
        sdissolve(startsh);
        // Connect fakesh to the segment [a,b].
        ssbond(startsh, abseg);
        fakesh = startsh; // Do not mark it!
        // Delete the degenerated subface.
        shellfacedealloc(subfaces, neighsh.sh);
      }
      // Save the fakesh in list (for re-creating the face ring).
      cavesegshlist->newindex((void **) &parysh);
      *parysh = fakesh;
    } // i
    caveshlist->restart();

    // Re-create the face ring.
    if (cavesegshlist->objects > 1) {
      for (i = 0; i < cavesegshlist->objects; i++) {
        parysh = (face *) fastlookup(cavesegshlist, i);
        fakesh = *parysh;
        // Get the next face in the ring.
        j = (i + 1) % cavesegshlist->objects;
        parysh = (face *) fastlookup(cavesegshlist, j);
        nextsh = *parysh;
        sbond1(fakesh, nextsh);
      }
    }

    // Delete the two subsegments containing p.
    shellfacedealloc(subsegs, parentseg->sh);
    shellfacedealloc(subsegs, prevseg.sh);
    // Return the new segment.
    *parentseg = abseg;
  } else {
    // p is inside the surface.
    if (b->verbose > 2) {
      printf("      Remove vertex %d from surface.\n", pointmark(delpt));
    }
    // Let 'delpt' be its apex.
    senextself(*parentsh);
    // For unifying the code, we add parentsh to list.
    cavesegshlist->newindex((void **) &parysh);
    *parysh = *parentsh;
  }

  // Remove the point (p).

  for (it = 0; it < cavesegshlist->objects; it++) {
    parentsh = (face *) fastlookup(cavesegshlist, it); // [a,b,p]
    senextself(*parentsh); // [b,p,a].
    spivotself(*parentsh);
    if (sorg(*parentsh) != delpt) sesymself(*parentsh);
    // now parentsh is [p,b,#].
    if (sorg(*parentsh) != delpt) {
      // The vertex has already been removed in above special case.
      continue;
    }

    while (1) {      
      // Initialize the flip edge list. Re-use 'caveshlist'.
      spinsh = *parentsh; // [p, b, #]
      while (1) {
        caveshlist->newindex((void **) &parysh);
        *parysh = spinsh;
        senext2self(spinsh);
        spivotself(spinsh);
        if (spinsh.sh == parentsh->sh) break;
        if (sorg(spinsh) != delpt) sesymself(spinsh);
      } // while (1)

      if (caveshlist->objects == 3) {
        // Delete the point by a 3-to-1 flip.
        for (i = 0; i < 3; i++) {
          parysh = (face *) fastlookup(caveshlist, i);
          flipfaces[i] = *parysh;
        }
        flip31(flipfaces, lawson);
        for (i = 0; i < 3; i++) { 
          shellfacedealloc(subfaces, flipfaces[i].sh);
        }
        caveshlist->restart();
        // Save the new subface.
        caveshbdlist->newindex((void **) &parysh);
        *parysh = flipfaces[3];
        // The vertex is removed.
        break;
      }

      // Search an edge to flip.
      for (i = 0; i < caveshlist->objects; i++) {
        parysh = (face *) fastlookup(caveshlist, i);
        flipfaces[0] = *parysh;
        spivot(flipfaces[0], flipfaces[1]);
        if (sorg(flipfaces[0]) != sdest(flipfaces[1])) 
          sesymself(flipfaces[1]);
        // Skip this edge if it belongs to a faked subface.
        if (!smarktested(flipfaces[0]) && !smarktested(flipfaces[1])) {
          pa = sorg(flipfaces[0]);
          pb = sdest(flipfaces[0]);
          pc = sapex(flipfaces[0]);
          pd = sapex(flipfaces[1]);
          calculateabovepoint4(pa, pb, pc, pd);
          // Check if a 2-to-2 flip is possible.
          ori1 = orient3d(pc, pd, dummypoint, pa);
          ori2 = orient3d(pc, pd, dummypoint, pb);
          if (ori1 * ori2 < 0) {
            // A 2-to-2 flip is found.
            flip22(flipfaces, lawson, 0);
            // The i-th edge is flipped. The i-th and (i-1)-th subfaces are
            //   changed. The 'flipfaces[1]' contains p as its apex.
            senext2(flipfaces[1], *parentsh);
            // Save the new subface.
            caveshbdlist->newindex((void **) &parysh);
            *parysh = flipfaces[0];
            break;
          }
        } //
      } // i

      if (i == caveshlist->objects) {
        // Do a flip22 and a flip31 to remove p.
        parysh = (face *) fastlookup(caveshlist, 0);
        flipfaces[0] = *parysh;
        spivot(flipfaces[0], flipfaces[1]);
        if (sorg(flipfaces[0]) != sdest(flipfaces[1])) {
          sesymself(flipfaces[1]);
        }
        flip22(flipfaces, lawson, 0);
        senext2(flipfaces[1], *parentsh);
        // Save the new subface.
        caveshbdlist->newindex((void **) &parysh);
        *parysh = flipfaces[0];
      }

      // The edge list at p are changed.
      caveshlist->restart();
    } // while (1)

  } // it

  cavesegshlist->restart();

  if (b->verbose > 2) {
    printf("      Created %ld new subfaces.\n", caveshbdlist->objects);
  }


  if (lawson) {
    lawsonflip();
  }

  return 0;
}